

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus
checkOptionValue(HighsLogOptions *report_log_options,OptionRecordString *option,string *value)

{
  __type _Var1;
  bool bVar2;
  string *__lhs;
  
  __lhs = &(option->super_OptionRecord).name;
  _Var1 = std::operator==(__lhs,&kPresolveString_abi_cxx11_);
  if (_Var1) {
    bVar2 = commandLineOffChooseOnOk(report_log_options,__lhs,value);
    if ((!bVar2) && (bVar2 = std::operator!=(value,"mip"), bVar2)) {
      return kIllegalValue;
    }
  }
  else {
    _Var1 = std::operator==(__lhs,&kSolverString_abi_cxx11_);
    if (_Var1) {
      bVar2 = commandLineSolverOk(report_log_options,value);
    }
    else {
      _Var1 = std::operator==(__lhs,&kParallelString_abi_cxx11_);
      if ((_Var1) || (_Var1 = std::operator==(__lhs,&kRunCrossoverString_abi_cxx11_), _Var1)) {
        bVar2 = commandLineOffChooseOnOk(report_log_options,__lhs,value);
      }
      else {
        _Var1 = std::operator==(__lhs,&kRangingString_abi_cxx11_);
        if (!_Var1) {
          return kOk;
        }
        bVar2 = commandLineOffOnOk(report_log_options,__lhs,value);
      }
    }
    if (bVar2 == false) {
      return kIllegalValue;
    }
  }
  return kOk;
}

Assistant:

OptionStatus checkOptionValue(const HighsLogOptions& report_log_options,
                              OptionRecordString& option,
                              const std::string value) {
  // Setting a string option. For some options only particular values
  // are permitted, so check them
  if (option.name == kPresolveString) {
    if (!commandLineOffChooseOnOk(report_log_options, option.name, value) &&
        value != "mip")
      return OptionStatus::kIllegalValue;
  } else if (option.name == kSolverString) {
    if (!commandLineSolverOk(report_log_options, value))
      return OptionStatus::kIllegalValue;
  } else if (option.name == kParallelString) {
    if (!commandLineOffChooseOnOk(report_log_options, option.name, value))
      return OptionStatus::kIllegalValue;
  } else if (option.name == kRunCrossoverString) {
    if (!commandLineOffChooseOnOk(report_log_options, option.name, value))
      return OptionStatus::kIllegalValue;
  } else if (option.name == kRangingString) {
    if (!commandLineOffOnOk(report_log_options, option.name, value))
      return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}